

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

int __thiscall QHeaderView::sectionSizeHint(QHeaderView *this,int logicalIndex)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  QHeaderViewPrivate *this_00;
  int *piVar4;
  int in_ESI;
  QHeaderView *in_RDI;
  long in_FS_OFFSET;
  QHeaderViewPrivate *d;
  int hint;
  QSize size;
  QVariant value;
  QHeaderView *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  int iVar5;
  int local_50;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QHeaderView *)0x835854);
  bVar2 = isSectionHidden((QHeaderView *)this_00,(int)((ulong)in_RDI >> 0x20));
  if (bVar2) {
    local_50 = 0;
  }
  else {
    if (-1 < in_ESI) {
      iVar5 = in_ESI;
      iVar3 = count((QHeaderView *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      if (iVar5 < iVar3) {
        QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
        (**(code **)(*(long *)pQVar1 + 0xa0))(&local_28,pQVar1,in_ESI,this_00->orientation,0xd);
        bVar2 = ::QVariant::isValid((QVariant *)
                                    CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        if (bVar2) {
          qvariant_cast<QSize>((QVariant *)CONCAT44(iVar5,in_stack_ffffffffffffff88));
        }
        else {
          (**(code **)(*(long *)&(in_RDI->super_QAbstractItemView).super_QAbstractScrollArea.
                                 super_QFrame.super_QWidget + 0x308))(in_RDI,in_ESI);
        }
        if (this_00->orientation == Horizontal) {
          iVar3 = QSize::width((QSize *)0x835983);
        }
        else {
          iVar3 = QSize::height((QSize *)0x835993);
        }
        minimumSectionSize(in_RDI);
        maximumSectionSize(in_stack_ffffffffffffff78);
        piVar4 = qBound<int>((int *)in_RDI,(int *)CONCAT44(iVar5,iVar3),
                             (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        local_50 = *piVar4;
        ::QVariant::~QVariant((QVariant *)&local_28);
        goto LAB_008359df;
      }
    }
    local_50 = -1;
  }
LAB_008359df:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_50;
  }
  __stack_chk_fail();
}

Assistant:

int QHeaderView::sectionSizeHint(int logicalIndex) const
{
    Q_D(const QHeaderView);
    if (isSectionHidden(logicalIndex))
        return 0;
    if (logicalIndex < 0 || logicalIndex >= count())
        return -1;
    QSize size;
    QVariant value = d->model->headerData(logicalIndex, d->orientation, Qt::SizeHintRole);
    if (value.isValid())
        size = qvariant_cast<QSize>(value);
    else
        size = sectionSizeFromContents(logicalIndex);
    int hint = d->orientation == Qt::Horizontal ? size.width() : size.height();
    return qBound(minimumSectionSize(), hint, maximumSectionSize());
}